

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *pfVar1;
  int iVar2;
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *pfVar3;
  pointer ptVar4;
  pointer __p;
  ulong uVar5;
  bool bVar6;
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  thread local_28;
  
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp:97:21)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp:97:21)>
             ::_M_manager;
  pfVar3 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)operator_new(0x20);
  std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::function
            (pfVar3,(function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)&local_48);
  pfVar1 = TLS::BASE<tls_data_t,1024u>::_details::_thread_exit_callback;
  local_50 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0;
  bVar6 = TLS::BASE<tls_data_t,1024u>::_details::_thread_exit_callback !=
          (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0;
  TLS::BASE<tls_data_t,1024u>::_details::_thread_exit_callback = pfVar3;
  if (bVar6) {
    std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>::operator()
              ((default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_> *)
               &TLS::BASE<tls_data_t,1024u>::_details::_thread_exit_callback,pfVar1);
    if (local_50 != (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0) {
      std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>::operator()
                ((default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_> *)
                 &local_50,local_50);
    }
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_48._M_unused._M_object = (long *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp:108:22)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp:108:22)>
             ::_M_manager;
  pfVar3 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)operator_new(0x20);
  std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::function
            (pfVar3,(function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)&local_48);
  pfVar1 = TLS::BASE<tls_data_t,1024u>::_details::_thread_enter_callback;
  bVar6 = TLS::BASE<tls_data_t,1024u>::_details::_thread_enter_callback !=
          (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0;
  TLS::BASE<tls_data_t,1024u>::_details::_thread_enter_callback = pfVar3;
  if (bVar6) {
    std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>::operator()
              ((default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_> *)
               &TLS::BASE<tls_data_t,1024u>::_details::_thread_enter_callback,pfVar1);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (main::n_threads == '\0') {
    main_cold_1();
  }
  if (main::threads == '\0') {
    iVar2 = __cxa_guard_acquire(&main::threads);
    if (iVar2 != 0) {
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&main::threads,CONCAT44(main::n_threads._4_4_,(uint)main::n_threads),
                 (allocator_type *)local_48._M_pod_data);
      __cxa_atexit(std::vector<std::thread,_std::allocator<std::thread>_>::~vector,&main::threads,
                   &__dso_handle);
      __cxa_guard_release(&main::threads);
    }
  }
  local_50 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0;
  ptVar4 = main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      local_28._M_id._M_thread = (id)0;
      local_48._M_unused._M_object = operator_new(0x10);
      *(undefined ***)local_48._M_unused._0_8_ = &PTR___State_00104d98;
      *(function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> ***)
       ((long)local_48._M_unused._0_8_ + 8) = &local_50;
      std::thread::_M_start_thread(&local_28,&local_48,0);
      if ((long *)local_48._M_unused._0_8_ != (long *)0x0) {
        (**(code **)(*local_48._M_unused._M_object + 8))();
      }
      ptVar4 = main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[(long)local_50]._M_id._M_thread != 0) {
        std::terminate();
      }
      main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[(long)local_50]._M_id._M_thread =
           (native_handle_type)local_28._M_id._M_thread;
      local_50 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)
                 ((long)&(local_50->super__Function_base)._M_functor._M_unused + 1);
    } while (local_50 <
             (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)
             ((long)main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ptVar4 >> 3));
  }
  if (main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish != ptVar4) {
    uVar5 = 0;
    do {
      std::thread::join();
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)main::threads.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)main::threads.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  printf("n_threads: %u\n",(ulong)(uint)main::n_threads);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	(void)argv;
	(void)argc;

#ifdef TLS_DEBUG_
	tls::debug();
#endif

	auto thread_exit = [](tls::data_t & data) {
		assert(data._data.ptr != nullptr);
		printf("exit:%" PRIxPTR" %p\n", data._id, data._data.ptr);
		delete data._data.ptr;
		data._data.ptr = nullptr;
	};

	// tls::thread_exit() will be call once per thread when it exits - the calling thread will not be the acquire thread
	// try not to do heavy lifting in the callback as it could cause performance problems
	tls::thread_exit(thread_exit);

	auto thread_enter = [](tls::data_t & data) {
		assert(data._data.ptr == nullptr);
		printf("enter:%" PRIxPTR" %p\n", data._id, data._data.ptr);
		data._data.ptr = new int;
	};

	// tls::thread_enter() will be call on the first tls::acquire() once per thread - calling thread will be the aquire thread
	tls::thread_enter(thread_enter);

	static const size_t n_threads = std::thread::hardware_concurrency() * 5;
//	static const size_t n_threads = 1024;
	static std::vector<std::thread> threads(n_threads);

	for (size_t i = 0; i < threads.size(); ++i) {
		threads[i] = std::thread([&] { test(i); });
	}

	for (size_t i = 0; i < threads.size(); ++i) {
		threads[i].join();
	}

	printf("n_threads: %u\n", (uint32_t)n_threads);

	return 0;
}